

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logic_program_types.cpp
# Opt level: O1

void __thiscall Clasp::Asp::PrgDisj::detach(PrgDisj *this,LogicProgram *prg,bool full)

{
  undefined1 *puVar1;
  uint uVar2;
  PrgNode PVar3;
  pointer pPVar4;
  long lVar5;
  uint uVar6;
  ulong uVar7;
  pointer pPVar8;
  
  uVar2 = *(uint *)&(this->super_PrgHead).field_0x18;
  uVar6 = uVar2 & 0x7ffffff;
  if (uVar6 != 0) {
    PVar3 = (this->super_PrgHead).super_PrgNode;
    uVar7 = 0;
    do {
      PrgHead::removeSupport
                (&(prg->atoms_).ebo_.buf[*(uint *)(&(this->super_PrgHead).field_0x1c + uVar7)]->
                  super_PrgHead,
                 (PrgEdge)(((uint)((ulong)PVar3 >> 0x1c) & 0xfffffff0) + ((int)~uVar2 >> 0x1f) * -8
                          + 2));
      uVar7 = uVar7 + 4;
    } while (uVar6 << 2 != uVar7);
  }
  pPVar4 = (this->super_PrgHead).supports_.ebo_.buf;
  uVar7._0_4_ = (this->super_PrgHead).supports_.ebo_.size;
  uVar7._4_4_ = (this->super_PrgHead).supports_.ebo_.cap;
  (this->super_PrgHead).supports_.ebo_ = (ebo)0x0;
  if ((undefined4)uVar7 != 0) {
    lVar5 = 0;
    do {
      PrgBody::removeHead((prg->bodies_).ebo_.buf[*(uint *)((long)&pPVar4->rep + lVar5) >> 4],
                          &this->super_PrgHead,Normal);
      lVar5 = lVar5 + 4;
    } while ((uVar7 & 0xffffffff) << 2 != lVar5);
  }
  if (full) {
    (this->super_PrgHead).supports_.ebo_.size = 0;
    puVar1 = &(this->super_PrgHead).field_0x1b;
    *puVar1 = *puVar1 & 0xe7;
    PVar3 = (this->super_PrgHead).super_PrgNode;
    pPVar8 = pPVar4;
    if ((PVar3._7_1_ >> 6 & (~(ulong)PVar3 & 0xfffffff00000000) != 0) == 0) {
      (this->super_PrgHead).super_PrgNode = (PrgNode)((ulong)PVar3 | 0xcfffffff00000000);
    }
  }
  else {
    pPVar8 = (this->super_PrgHead).supports_.ebo_.buf;
    (this->super_PrgHead).supports_.ebo_.buf = pPVar4;
    (this->super_PrgHead).supports_.ebo_.size = (undefined4)uVar7;
    (this->super_PrgHead).supports_.ebo_.cap = uVar7._4_4_;
  }
  if (pPVar8 != (pointer)0x0) {
    operator_delete(pPVar8);
    return;
  }
  return;
}

Assistant:

void PrgDisj::detach(LogicProgram& prg, bool full) {
	PrgEdge edge = PrgEdge::newEdge(*this, PrgEdge::Choice);
	for (atom_iterator it = begin(), end = this->end(); it != end; ++it) {
		prg.getAtom(*it)->removeSupport(edge);
	}
	EdgeVec temp; temp.swap(supports_);
	for (PrgDisj::sup_iterator it = temp.begin(), end = temp.end(); it != end; ++it) {
		prg.getBody(it->node())->removeHead(this, PrgEdge::Normal);
	}
	if (full) {
		clearSupports();
		markRemoved();
	}
	else {
		supports_.swap(temp);
	}
}